

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDComponentPtr::CompareType(ON_SubDComponentPtr *a,ON_SubDComponentPtr *b)

{
  Type a_00;
  Type b_00;
  int iVar1;
  
  if (a == b) {
    iVar1 = 0;
  }
  else if (a == (ON_SubDComponentPtr *)0x0) {
    iVar1 = 1;
  }
  else {
    if (b != (ON_SubDComponentPtr *)0x0) {
      a_00 = ComponentType(a);
      b_00 = ComponentType(b);
      iVar1 = CompareComponentPtrType(a_00,b_00);
      return iVar1;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_SubDComponentPtr::CompareType(
  const ON_SubDComponentPtr* a,
  const ON_SubDComponentPtr* b
  )
{
  if ( a == b )
    return 0;
    // sort nullptrs to ends of arrays
  if ( nullptr == a )
    return 1; // nonzero b < nullptr a
  if ( nullptr == b )
    return -1; // nonzero a < nullptr b
  return ON_SubDComponentPtr::CompareComponentPtrType(a->ComponentType(), b->ComponentType());
}